

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O2

void icu_63::CollationKeys::writeSortKeyUpToQuaternary
               (CollationIterator *iter,UBool *compressibleBytes,CollationSettings *settings,
               SortKeyByteSink *sink,Level minLevel,LevelCallback *callback,UBool preflight,
               UErrorCode *errorCode)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  UBool UVar4;
  byte bVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uchar *puVar14;
  uint uVar15;
  uchar *puVar16;
  ulong uVar17;
  uchar uVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  int32_t appendCapacity;
  uint32_t b;
  int iVar22;
  uint32_t uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  uint local_1a0;
  uint local_178;
  char buffer [3];
  uint local_16c;
  int local_160;
  SortKeyLevel quaternaries;
  SortKeyLevel secondaries;
  SortKeyLevel tertiaries;
  SortKeyLevel cases;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar2 = settings->options;
  uVar25 = (uVar2 >> 7 & 8 | *(uint *)(levelMasks + (long)((int)uVar2 >> 0xc) * 4)) >>
           ((byte)minLevel & 0x1f);
  bVar21 = (byte)minLevel & 0x1f;
  uVar26 = uVar25 << bVar21;
  if (uVar25 << bVar21 == 0) {
    return;
  }
  uVar25 = settings->variableTop + 1;
  if ((uVar2 & 0xc) == 0) {
    uVar25 = 0;
  }
  uVar15 = 0x3f3f;
  if ((uVar2 & 0x600) == 0x200) {
    uVar15 = 0xff3f;
  }
  cases.buffer.ptr = cases.buffer.stackArray;
  quaternaries.buffer.capacity = 0x28;
  cases.buffer.needToRelease = '\0';
  cases.len = 0;
  cases.ok = '\x01';
  secondaries.buffer.ptr = secondaries.buffer.stackArray;
  secondaries.buffer.needToRelease = '\0';
  secondaries.len = 0;
  secondaries.ok = '\x01';
  tertiaries.buffer.ptr = tertiaries.buffer.stackArray;
  tertiaries.buffer.needToRelease = '\0';
  tertiaries.len = 0;
  tertiaries.ok = '\x01';
  quaternaries.buffer.ptr = quaternaries.buffer.stackArray;
  local_160 = 0;
  quaternaries.buffer.needToRelease = '\0';
  quaternaries.len = 0;
  quaternaries.ok = '\x01';
  local_178 = 0;
  iVar24 = 0;
  iVar11 = 0;
  iVar9 = 0;
  iVar10 = 0;
  local_16c = 0;
  secondaries.buffer.capacity = quaternaries.buffer.capacity;
  tertiaries.buffer.capacity = quaternaries.buffer.capacity;
  cases.buffer.capacity = quaternaries.buffer.capacity;
  do {
    do {
      if (iter->cesIndex == (iter->ceBuffer).length) {
        (iter->ceBuffer).length = 0;
        iter->cesIndex = 0;
      }
      uVar13 = CollationIterator::nextCE(iter,errorCode);
      uVar20 = uVar13 >> 0x20;
      if ((0x2000000ffffffff < uVar13) && ((uint)(uVar13 >> 0x20) < uVar25)) {
        if (iVar24 != 0) {
          for (uVar23 = iVar24 + 0x1b; 0x70 < (int)(uVar23 - 0x1c); uVar23 = uVar23 - 0x71) {
            anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,0x8c);
          }
          anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,uVar23);
        }
        do {
          uVar23 = (uint32_t)uVar20;
          if ((uVar26 & 0x20) != 0) {
            if (settings->reorderTable != (uint8_t *)0x0) {
              uVar23 = CollationSettings::reorder(settings,uVar23);
            }
            if (0x1affffff < uVar23) {
              anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,0x1b);
            }
            appendCapacity = 1;
            uVar18 = (uchar)uVar23;
            if (((uVar23 & 0xff0000) != 0) && (appendCapacity = 2, (uVar23 & 0xff00) != 0)) {
              appendCapacity = 4 - (uint)(uVar18 == '\0');
            }
            iVar6 = quaternaries.len;
            if ((quaternaries.len + appendCapacity <= quaternaries.buffer.capacity) ||
               (UVar4 = anon_unknown_4::SortKeyLevel::ensureCapacity(&quaternaries,appendCapacity),
               iVar6 = quaternaries.len, UVar4 != '\0')) {
              quaternaries.buffer.ptr[iVar6] = (uchar)(uVar23 >> 0x18);
              quaternaries.len = iVar6 + 1;
              if ((uVar23 & 0xff0000) != 0) {
                quaternaries.buffer.ptr[iVar6 + 1] = (uchar)(uVar23 >> 0x10);
                quaternaries.len = iVar6 + 2;
                if ((uVar23 & 0xff00) != 0) {
                  quaternaries.buffer.ptr[iVar6 + 2] = (uchar)(uVar23 >> 8);
                  quaternaries.len = iVar6 + 3;
                  if (uVar18 != '\0') {
                    quaternaries.buffer.ptr[iVar6 + 3] = uVar18;
                    quaternaries.len = iVar6 + 4;
                  }
                }
              }
            }
          }
          do {
            uVar13 = CollationIterator::nextCE(iter,errorCode);
            uVar20 = uVar13 >> 0x20;
          } while (uVar20 == 0);
          iVar24 = 0;
        } while ((0x2000000ffffffff < uVar13) && ((uint)(uVar13 >> 0x20) < uVar25));
      }
      uVar23 = (uint32_t)uVar20;
      if (((uVar26 & 2) != 0) && (1 < uVar23)) {
        uVar7 = (uint32_t)(uVar20 >> 0x18);
        cVar1 = compressibleBytes[uVar20 >> 0x18];
        if (settings->reorderTable != (uint8_t *)0x0) {
          uVar7 = CollationSettings::reorder(settings,uVar23);
          uVar20 = (ulong)uVar7;
          uVar7 = uVar7 >> 0x18;
        }
        uVar23 = (uint32_t)uVar20;
        if ((cVar1 == '\0') || (uVar7 != local_16c >> 0x18)) {
          if ((local_16c != 0) && ((b = 0xff, local_16c <= uVar23 || (b = 3, 0x2ffffff < uVar23))))
          {
            SortKeyByteSink::Append(sink,b);
          }
          SortKeyByteSink::Append(sink,uVar7);
          local_16c = 0;
          if (cVar1 != '\0') {
            local_16c = uVar23;
          }
        }
        if ((uVar20 & 0xff0000) != 0) {
          buffer[0] = (char)(uVar20 >> 0x10);
          buffer[1] = (char)(uVar20 >> 8);
          buffer[2] = (char)uVar20;
          uVar17 = (ulong)(3 - (buffer[2] == '\0'));
          if ((uVar20 & 0xff00) == 0) {
            uVar17 = 1;
          }
          (*(sink->super_ByteSink)._vptr_ByteSink[2])(sink,buffer,uVar17);
        }
        if ((preflight == '\0') && (sink->capacity_ < sink->appended_)) {
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00232479;
          goto LAB_0023248c;
        }
      }
      uVar8 = (uint)uVar13;
    } while (uVar8 == 0);
    if (((uVar26 & 4) != 0) && (0xffff < uVar8)) {
      uVar19 = (uint)(uVar13 >> 0x10);
      uVar12 = uVar19 & 0xffff;
      if (((uVar19 & 0xffff) == 0x500) && ((uVar2 >> 0xb & 1) == 0 || uVar23 != 0x2000000)) {
        iVar9 = iVar9 + 1;
      }
      else if ((uVar2 >> 0xb & 1) == 0) {
        if (iVar9 != 0) {
          for (iVar9 = iVar9 + -0x46; 0x20 < iVar9 + 0x45; iVar9 = iVar9 + -0x21) {
            anon_unknown_4::SortKeyLevel::appendByte(&secondaries,0x25);
          }
          uVar7 = -iVar9;
          if (uVar8 < 0x5000000) {
            uVar7 = iVar9 + 0x4a;
          }
          anon_unknown_4::SortKeyLevel::appendByte(&secondaries,uVar7);
        }
        iVar9 = 0;
        anon_unknown_4::SortKeyLevel::appendWeight16(&secondaries,uVar12);
      }
      else {
        if (iVar9 == 0) {
          iVar9 = 0;
        }
        else {
          iVar22 = (iVar9 + -1) % 0x21;
          uVar7 = 0x45 - iVar22;
          if (local_178 < 0x500) {
            uVar7 = iVar22 + 5;
          }
          anon_unknown_4::SortKeyLevel::appendByte(&secondaries,uVar7);
          for (iVar9 = (iVar9 + -1) - iVar22; 0 < iVar9; iVar9 = iVar9 + -0x21) {
            anon_unknown_4::SortKeyLevel::appendByte(&secondaries,0x25);
          }
        }
        if (uVar23 - 1 < 0x2000000) {
          if (local_160 < secondaries.len + -1) {
            puVar14 = secondaries.buffer.ptr + local_160;
            puVar16 = secondaries.buffer.ptr + (long)secondaries.len + -2;
            do {
              uVar18 = *puVar14;
              *puVar14 = puVar16[1];
              puVar14 = puVar14 + 1;
              puVar16[1] = uVar18;
              bVar27 = puVar14 < puVar16;
              puVar16 = puVar16 + -1;
            } while (bVar27);
          }
          anon_unknown_4::SortKeyLevel::appendByte(&secondaries,(uVar23 != 1) + 1);
          local_178 = 0;
          local_160 = secondaries.len;
        }
        else {
          iVar22 = 2 - (uint)((uVar13 & 0xff0000) == 0);
          local_178 = uVar12;
          if ((secondaries.len + iVar22 <= secondaries.buffer.capacity) ||
             (UVar4 = anon_unknown_4::SortKeyLevel::ensureCapacity(&secondaries,iVar22),
             UVar4 != '\0')) {
            uVar18 = (uchar)(uVar13 >> 0x18);
            if ((uVar13 & 0xff0000) == 0) {
              secondaries.buffer.ptr[secondaries.len] = uVar18;
              secondaries.len = secondaries.len + 1;
            }
            else {
              secondaries.buffer.ptr[secondaries.len] = (uchar)uVar12;
              secondaries.buffer.ptr[(long)secondaries.len + 1] = uVar18;
              secondaries.len = secondaries.len + 2;
            }
          }
        }
      }
    }
    if ((uVar26 & 8) != 0) {
      if (uVar2 < 0x1000) {
        if (uVar23 != 0) {
LAB_00232064:
          uVar19 = (uint)(byte)(uVar13 >> 8);
          if (uVar19 < 2 || (uVar13 & 0xc000) != 0) {
            if ((uVar2 >> 8 & 1) == 0) {
              if (iVar10 != 0) {
                if ((uVar19 < 2) && (cases.len == 0)) goto LAB_00232196;
                for (; 6 < iVar10 + -1; iVar10 = iVar10 + -7) {
                  anon_unknown_4::SortKeyLevel::appendByte(&cases,0x70);
                }
                iVar22 = 0xe - iVar10;
                if (uVar19 < 2) {
                  iVar22 = iVar10;
                }
                anon_unknown_4::SortKeyLevel::appendByte(&cases,iVar22 << 4);
              }
              iVar10 = 0;
              if (1 < uVar19) {
                uVar19 = ((uint)(uVar13 >> 10) & 0x30) + 0xd0;
              }
            }
            else {
              if (iVar10 != 0) {
                uVar23 = iVar10 * 0x10 + 0x20;
                for (iVar10 = iVar10 + -1; 0xc < iVar10; iVar10 = iVar10 + -0xd) {
                  anon_unknown_4::SortKeyLevel::appendByte(&cases,0x30);
                  uVar23 = uVar23 - 0xd0;
                }
                anon_unknown_4::SortKeyLevel::appendByte(&cases,uVar23);
              }
              iVar10 = 0;
              if (1 < uVar19) {
                uVar19 = ~uVar8 >> 10 & 0x30;
              }
            }
LAB_00232196:
            anon_unknown_4::SortKeyLevel::appendByte(&cases,uVar19);
          }
          else {
            iVar10 = iVar10 + 1;
          }
        }
      }
      else if (0xffff < uVar8) goto LAB_00232064;
    }
    if ((uVar26 & 0x10) != 0) {
      uVar19 = uVar15 & uVar8;
      if (uVar19 == 0x500) {
        iVar11 = iVar11 + 1;
      }
      else {
        if ((uVar2 & 0x600) == 0x200) {
          if ((uVar2 >> 8 & 1) == 0) {
            if (iVar11 != 0) {
              for (iVar11 = iVar11 + -0x46; 0x20 < iVar11 + 0x45; iVar11 = iVar11 + -0x21) {
                anon_unknown_4::SortKeyLevel::appendByte(&tertiaries,0x25);
              }
              uVar23 = -iVar11;
              if (uVar19 < 0x500) {
                uVar23 = iVar11 + 0x4a;
              }
              anon_unknown_4::SortKeyLevel::appendByte(&tertiaries,uVar23);
            }
            uVar12 = uVar19 + 0x4000;
            goto LAB_002322e8;
          }
          if (0x100 < uVar19) {
            if (uVar8 < 0x10000) {
              uVar19 = uVar19 + 0x4000;
            }
            else {
              uVar12 = uVar19 ^ 0xc000;
              uVar19 = uVar12 - 0x4000;
              if (0xc4ff < uVar12) {
                uVar19 = uVar12;
              }
            }
          }
          uVar12 = uVar19;
          if (iVar11 != 0) {
            for (iVar11 = iVar11 + -0xc6; 0x20 < iVar11 + 0xc5; iVar11 = iVar11 + -0x21) {
              anon_unknown_4::SortKeyLevel::appendByte(&tertiaries,0xa5);
            }
            uVar23 = -iVar11;
            if (uVar19 < 0x8500) {
              uVar23 = iVar11 + 0x14a;
            }
            anon_unknown_4::SortKeyLevel::appendByte(&tertiaries,uVar23);
          }
        }
        else {
          if (iVar11 != 0) {
            for (iVar11 = iVar11 + -0xc6; 0x60 < iVar11 + 0xc5; iVar11 = iVar11 + -0x61) {
              anon_unknown_4::SortKeyLevel::appendByte(&tertiaries,0x65);
            }
            uVar23 = -iVar11;
            if (uVar19 < 0x500) {
              uVar23 = iVar11 + 0xca;
            }
            anon_unknown_4::SortKeyLevel::appendByte(&tertiaries,uVar23);
          }
          uVar12 = uVar19 + 0xc000;
LAB_002322e8:
          if (uVar19 < 0x501) {
            uVar12 = uVar19;
          }
        }
        iVar11 = 0;
        anon_unknown_4::SortKeyLevel::appendWeight16(&tertiaries,uVar12);
      }
    }
    if ((uVar26 & 0x20) != 0) {
      local_1a0 = uVar8 & 0xffff;
      if ((uVar8 & 0xffff) < 0x101 || (uVar13 & 0xc0) != 0) {
        if ((((uVar2 & 0xc) == 0) && (local_1a0 == 0x100)) && (quaternaries.len == 0)) {
          anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,1);
        }
        else {
          uVar23 = (uint)(uVar13 >> 6) & 0xff | 0xfc;
          if (local_1a0 == 0x100) {
            uVar23 = 1;
          }
          if (iVar24 != 0) {
            for (iVar24 = iVar24 + -0xfd; 0x70 < iVar24 + 0xfc; iVar24 = iVar24 + -0x71) {
              anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,0x8c);
            }
            uVar7 = -iVar24;
            if (local_1a0 == 0x100) {
              uVar7 = iVar24 + 0x118;
            }
            anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,uVar7);
          }
          iVar24 = 0;
          anon_unknown_4::SortKeyLevel::appendByte(&quaternaries,uVar23);
        }
      }
      else {
        iVar24 = iVar24 + 1;
      }
    }
  } while ((uVar8 & 0xff000000) != 0x1000000);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar21 = 1;
    if ((uVar26 & 4) != 0) {
      iVar9 = (*callback->_vptr_LevelCallback[2])(callback,2);
      UVar4 = secondaries.ok;
      if ((char)iVar9 == '\0') goto LAB_0023248c;
      SortKeyByteSink::Append(sink,1);
      (*(sink->super_ByteSink)._vptr_ByteSink[2])
                (sink,secondaries.buffer.ptr,(ulong)(secondaries.len - 1));
      bVar21 = UVar4 & 1;
    }
    if ((uVar26 & 8) != 0) {
      iVar9 = (*callback->_vptr_LevelCallback[2])(callback,3);
      if ((char)iVar9 == '\0') goto LAB_0023248c;
      bVar21 = bVar21 & cases.ok;
      SortKeyByteSink::Append(sink,1);
      iVar9 = 1;
      if (1 < cases.len) {
        iVar9 = cases.len;
      }
      bVar5 = 0;
      for (uVar13 = 0; iVar9 - 1 != uVar13; uVar13 = uVar13 + 1) {
        bVar3 = cases.buffer.ptr[uVar13];
        if (bVar5 != 0) {
          SortKeyByteSink::Append(sink,(uint)(byte)(cases.buffer.ptr[uVar13] >> 4 | bVar5));
          bVar3 = 0;
        }
        bVar5 = bVar3;
      }
      if (bVar5 != 0) {
        SortKeyByteSink::Append(sink,(uint)bVar5);
      }
    }
    if ((uVar26 & 0x10) != 0) {
      iVar9 = (*callback->_vptr_LevelCallback[2])(callback,4);
      UVar4 = tertiaries.ok;
      if ((char)iVar9 == '\0') goto LAB_0023248c;
      SortKeyByteSink::Append(sink,1);
      (*(sink->super_ByteSink)._vptr_ByteSink[2])
                (sink,tertiaries.buffer.ptr,(ulong)(tertiaries.len - 1));
      bVar21 = bVar21 & UVar4;
    }
    if ((uVar26 & 0x20) != 0) {
      iVar9 = (*callback->_vptr_LevelCallback[2])(callback,5);
      UVar4 = quaternaries.ok;
      if ((char)iVar9 == '\0') goto LAB_0023248c;
      SortKeyByteSink::Append(sink,1);
      (*(sink->super_ByteSink)._vptr_ByteSink[2])
                (sink,quaternaries.buffer.ptr,(ulong)(quaternaries.len - 1));
      bVar21 = bVar21 & UVar4;
    }
    if (bVar21 != 0) {
LAB_00232479:
      if (sink->buffer_ != (char *)0x0) goto LAB_0023248c;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_0023248c:
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&quaternaries.buffer);
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&tertiaries.buffer);
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&secondaries.buffer);
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&cases.buffer);
  return;
}

Assistant:

void
CollationKeys::writeSortKeyUpToQuaternary(CollationIterator &iter,
                                          const UBool *compressibleBytes,
                                          const CollationSettings &settings,
                                          SortKeyByteSink &sink,
                                          Collation::Level minLevel, LevelCallback &callback,
                                          UBool preflight, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }

    int32_t options = settings.options;
    // Set of levels to process and write.
    uint32_t levels = levelMasks[CollationSettings::getStrength(options)];
    if((options & CollationSettings::CASE_LEVEL) != 0) {
        levels |= Collation::CASE_LEVEL_FLAG;
    }
    // Minus the levels below minLevel.
    levels &= ~(((uint32_t)1 << minLevel) - 1);
    if(levels == 0) { return; }

    uint32_t variableTop;
    if((options & CollationSettings::ALTERNATE_MASK) == 0) {
        variableTop = 0;
    } else {
        // +1 so that we can use "<" and primary ignorables test out early.
        variableTop = settings.variableTop + 1;
    }

    uint32_t tertiaryMask = CollationSettings::getTertiaryMask(options);

    SortKeyLevel cases;
    SortKeyLevel secondaries;
    SortKeyLevel tertiaries;
    SortKeyLevel quaternaries;

    uint32_t prevReorderedPrimary = 0;  // 0==no compression
    int32_t commonCases = 0;
    int32_t commonSecondaries = 0;
    int32_t commonTertiaries = 0;
    int32_t commonQuaternaries = 0;

    uint32_t prevSecondary = 0;
    int32_t secSegmentStart = 0;

    for(;;) {
        // No need to keep all CEs in the buffer when we write a sort key.
        iter.clearCEsIfNoneRemaining();
        int64_t ce = iter.nextCE(errorCode);
        uint32_t p = (uint32_t)(ce >> 32);
        if(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY) {
            // Variable CE, shift it to quaternary level.
            // Ignore all following primary ignorables, and shift further variable CEs.
            if(commonQuaternaries != 0) {
                --commonQuaternaries;
                while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                    quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                    commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                }
                // Shifted primary weights are lower than the common weight.
                quaternaries.appendByte(QUAT_COMMON_LOW + commonQuaternaries);
                commonQuaternaries = 0;
            }
            do {
                if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
                    if(settings.hasReordering()) {
                        p = settings.reorder(p);
                    }
                    if((p >> 24) >= QUAT_SHIFTED_LIMIT_BYTE) {
                        // Prevent shifted primary lead bytes from
                        // overlapping with the common compression range.
                        quaternaries.appendByte(QUAT_SHIFTED_LIMIT_BYTE);
                    }
                    quaternaries.appendWeight32(p);
                }
                do {
                    ce = iter.nextCE(errorCode);
                    p = (uint32_t)(ce >> 32);
                } while(p == 0);
            } while(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY);
        }
        // ce could be primary ignorable, or NO_CE, or the merge separator,
        // or a regular primary CE, but it is not variable.
        // If ce==NO_CE, then write nothing for the primary level but
        // terminate compression on all levels and then exit the loop.
        if(p > Collation::NO_CE_PRIMARY && (levels & Collation::PRIMARY_LEVEL_FLAG) != 0) {
            // Test the un-reordered primary for compressibility.
            UBool isCompressible = compressibleBytes[p >> 24];
            if(settings.hasReordering()) {
                p = settings.reorder(p);
            }
            uint32_t p1 = p >> 24;
            if(!isCompressible || p1 != (prevReorderedPrimary >> 24)) {
                if(prevReorderedPrimary != 0) {
                    if(p < prevReorderedPrimary) {
                        // No primary compression terminator
                        // at the end of the level or merged segment.
                        if(p1 > Collation::MERGE_SEPARATOR_BYTE) {
                            sink.Append(Collation::PRIMARY_COMPRESSION_LOW_BYTE);
                        }
                    } else {
                        sink.Append(Collation::PRIMARY_COMPRESSION_HIGH_BYTE);
                    }
                }
                sink.Append(p1);
                if(isCompressible) {
                    prevReorderedPrimary = p;
                } else {
                    prevReorderedPrimary = 0;
                }
            }
            char p2 = (char)(p >> 16);
            if(p2 != 0) {
                char buffer[3] = { p2, (char)(p >> 8), (char)p };
                sink.Append(buffer, (buffer[1] == 0) ? 1 : (buffer[2] == 0) ? 2 : 3);
            }
            // Optimization for internalNextSortKeyPart():
            // When the primary level overflows we can stop because we need not
            // calculate (preflight) the whole sort key length.
            if(!preflight && sink.Overflowed()) {
                if(U_SUCCESS(errorCode) && !sink.IsOk()) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                }
                return;
            }
        }

        uint32_t lower32 = (uint32_t)ce;
        if(lower32 == 0) { continue; }  // completely ignorable, no secondary/case/tertiary/quaternary

        if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
            uint32_t s = lower32 >> 16;
            if(s == 0) {
                // secondary ignorable
            } else if(s == Collation::COMMON_WEIGHT16 &&
                    ((options & CollationSettings::BACKWARD_SECONDARY) == 0 ||
                        p != Collation::MERGE_SEPARATOR_PRIMARY)) {
                // s is a common secondary weight, and
                // backwards-secondary is off or the ce is not the merge separator.
                ++commonSecondaries;
            } else if((options & CollationSettings::BACKWARD_SECONDARY) == 0) {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    while(commonSecondaries >= SEC_COMMON_MAX_COUNT) {
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(s < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + commonSecondaries;
                    } else {
                        b = SEC_COMMON_HIGH - commonSecondaries;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries = 0;
                }
                secondaries.appendWeight16(s);
            } else {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    // Append reverse weights. The level will be re-reversed later.
                    int32_t remainder = commonSecondaries % SEC_COMMON_MAX_COUNT;
                    uint32_t b;
                    if(prevSecondary < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + remainder;
                    } else {
                        b = SEC_COMMON_HIGH - remainder;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries -= remainder;
                    // commonSecondaries is now a multiple of SEC_COMMON_MAX_COUNT.
                    while(commonSecondaries > 0) {  // same as >= SEC_COMMON_MAX_COUNT
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    // commonSecondaries == 0
                }
                if(0 < p && p <= Collation::MERGE_SEPARATOR_PRIMARY) {
                    // The backwards secondary level compares secondary weights backwards
                    // within segments separated by the merge separator (U+FFFE).
                    uint8_t *secs = secondaries.data();
                    int32_t last = secondaries.length() - 1;
                    if(secSegmentStart < last) {
                        uint8_t *q = secs + secSegmentStart;
                        uint8_t *r = secs + last;
                        do {
                            uint8_t b = *q;
                            *q++ = *r;
                            *r-- = b;
                        } while(q < r);
                    }
                    secondaries.appendByte(p == Collation::NO_CE_PRIMARY ?
                        Collation::LEVEL_SEPARATOR_BYTE : Collation::MERGE_SEPARATOR_BYTE);
                    prevSecondary = 0;
                    secSegmentStart = secondaries.length();
                } else {
                    secondaries.appendReverseWeight16(s);
                    prevSecondary = s;
                }
            }
        }

        if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
            if((CollationSettings::getStrength(options) == UCOL_PRIMARY) ?
                    p == 0 : lower32 <= 0xffff) {
                // Primary+caseLevel: Ignore case level weights of primary ignorables.
                // Otherwise: Ignore case level weights of secondary ignorables.
                // For details see the comments in the CollationCompare class.
            } else {
                uint32_t c = (lower32 >> 8) & 0xff;  // case bits & tertiary lead byte
                U_ASSERT((c & 0xc0) != 0xc0);
                if((c & 0xc0) == 0 && c > Collation::LEVEL_SEPARATOR_BYTE) {
                    ++commonCases;
                } else {
                    if((options & CollationSettings::UPPER_FIRST) == 0) {
                        // lowerFirst: Compress common weights to nibbles 1..7..13, mixed=14, upper=15.
                        // If there are only common (=lowest) weights in the whole level,
                        // then we need not write anything.
                        // Level length differences are handled already on the next-higher level.
                        if(commonCases != 0 &&
                                (c > Collation::LEVEL_SEPARATOR_BYTE || !cases.isEmpty())) {
                            --commonCases;
                            while(commonCases >= CASE_LOWER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_LOWER_FIRST_COMMON_MIDDLE << 4);
                                commonCases -= CASE_LOWER_FIRST_COMMON_MAX_COUNT;
                            }
                            uint32_t b;
                            if(c <= Collation::LEVEL_SEPARATOR_BYTE) {
                                b = CASE_LOWER_FIRST_COMMON_LOW + commonCases;
                            } else {
                                b = CASE_LOWER_FIRST_COMMON_HIGH - commonCases;
                            }
                            cases.appendByte(b << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_LOWER_FIRST_COMMON_HIGH + (c >> 6)) << 4;  // 14 or 15
                        }
                    } else {
                        // upperFirst: Compress common weights to nibbles 3..15, mixed=2, upper=1.
                        // The compressed common case weights only go up from the "low" value
                        // because with upperFirst the common weight is the highest one.
                        if(commonCases != 0) {
                            --commonCases;
                            while(commonCases >= CASE_UPPER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_UPPER_FIRST_COMMON_LOW << 4);
                                commonCases -= CASE_UPPER_FIRST_COMMON_MAX_COUNT;
                            }
                            cases.appendByte((CASE_UPPER_FIRST_COMMON_LOW + commonCases) << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_UPPER_FIRST_COMMON_LOW - (c >> 6)) << 4;  // 2 or 1
                        }
                    }
                    // c is a separator byte 01,
                    // or a left-shifted nibble 0x10, 0x20, ... 0xf0.
                    cases.appendByte(c);
                }
            }
        }

        if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
            uint32_t t = lower32 & tertiaryMask;
            U_ASSERT((lower32 & 0xc000) != 0xc000);
            if(t == Collation::COMMON_WEIGHT16) {
                ++commonTertiaries;
            } else if((tertiaryMask & 0x8000) == 0) {
                // Tertiary weights without case bits.
                // Move lead bytes 06..3F to C6..FF for a large common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_ONLY_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_ONLY_COMMON_MIDDLE);
                        commonTertiaries -= TER_ONLY_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_ONLY_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_ONLY_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0xc000; }
                tertiaries.appendWeight16(t);
            } else if((options & CollationSettings::UPPER_FIRST) == 0) {
                // Tertiary weights with caseFirst=lowerFirst.
                // Move lead bytes 06..BF to 46..FF for the common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_LOWER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_LOWER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_LOWER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_LOWER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_LOWER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0x4000; }
                tertiaries.appendWeight16(t);
            } else {
                // Tertiary weights with caseFirst=upperFirst.
                // Do not change the artificial uppercase weight of a tertiary CE (0.0.ut),
                // to keep tertiary CEs well-formed.
                // Their case+tertiary weights must be greater than those of
                // primary and secondary CEs.
                //
                // Separator         01 -> 01      (unchanged)
                // Lowercase     02..04 -> 82..84  (includes uncased)
                // Common weight     05 -> 85..C5  (common-weight compression range)
                // Lowercase     06..3F -> C6..FF
                // Mixed case    42..7F -> 42..7F
                // Uppercase     82..BF -> 02..3F
                // Tertiary CE   86..BF -> C6..FF
                if(t <= Collation::NO_CE_WEIGHT16) {
                    // Keep separators unchanged.
                } else if(lower32 > 0xffff) {
                    // Invert case bits of primary & secondary CEs.
                    t ^= 0xc000;
                    if(t < (TER_UPPER_FIRST_COMMON_HIGH << 8)) {
                        t -= 0x4000;
                    }
                } else {
                    // Keep uppercase bits of tertiary CEs.
                    U_ASSERT(0x8600 <= t && t <= 0xbfff);
                    t += 0x4000;
                }
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_UPPER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_UPPER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_UPPER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < (TER_UPPER_FIRST_COMMON_LOW << 8)) {
                        b = TER_UPPER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_UPPER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                tertiaries.appendWeight16(t);
            }
        }

        if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
            uint32_t q = lower32 & 0xffff;
            if((q & 0xc0) == 0 && q > Collation::NO_CE_WEIGHT16) {
                ++commonQuaternaries;
            } else if(q == Collation::NO_CE_WEIGHT16 &&
                    (options & CollationSettings::ALTERNATE_MASK) == 0 &&
                    quaternaries.isEmpty()) {
                // If alternate=non-ignorable and there are only common quaternary weights,
                // then we need not write anything.
                // The only weights greater than the merge separator and less than the common weight
                // are shifted primary weights, which are not generated for alternate=non-ignorable.
                // There are also exactly as many quaternary weights as tertiary weights,
                // so level length differences are handled already on tertiary level.
                // Any above-common quaternary weight will compare greater regardless.
                quaternaries.appendByte(Collation::LEVEL_SEPARATOR_BYTE);
            } else {
                if(q == Collation::NO_CE_WEIGHT16) {
                    q = Collation::LEVEL_SEPARATOR_BYTE;
                } else {
                    q = 0xfc + ((q >> 6) & 3);
                }
                if(commonQuaternaries != 0) {
                    --commonQuaternaries;
                    while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                        quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                        commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(q < QUAT_COMMON_LOW) {
                        b = QUAT_COMMON_LOW + commonQuaternaries;
                    } else {
                        b = QUAT_COMMON_HIGH - commonQuaternaries;
                    }
                    quaternaries.appendByte(b);
                    commonQuaternaries = 0;
                }
                quaternaries.appendByte(q);
            }
        }

        if((lower32 >> 24) == Collation::LEVEL_SEPARATOR_BYTE) { break; }  // ce == NO_CE
    }

    if(U_FAILURE(errorCode)) { return; }

    // Append the beyond-primary levels.
    UBool ok = TRUE;
    if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::SECONDARY_LEVEL)) { return; }
        ok &= secondaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        secondaries.appendTo(sink);
    }

    if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::CASE_LEVEL)) { return; }
        ok &= cases.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        // Write pairs of nibbles as bytes, except separator bytes as themselves.
        int32_t length = cases.length() - 1;  // Ignore the trailing NO_CE.
        uint8_t b = 0;
        for(int32_t i = 0; i < length; ++i) {
            uint8_t c = (uint8_t)cases[i];
            U_ASSERT((c & 0xf) == 0 && c != 0);
            if(b == 0) {
                b = c;
            } else {
                sink.Append(b | (c >> 4));
                b = 0;
            }
        }
        if(b != 0) {
            sink.Append(b);
        }
    }

    if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::TERTIARY_LEVEL)) { return; }
        ok &= tertiaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        tertiaries.appendTo(sink);
    }

    if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::QUATERNARY_LEVEL)) { return; }
        ok &= quaternaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        quaternaries.appendTo(sink);
    }

    if(!ok || !sink.IsOk()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}